

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckInputLabel(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  int iVar2;
  AttVal *local_20;
  AttVal *av;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = Level2_Enabled(doc);
  if (BVar1 != no) {
    for (local_20 = node->attributes; local_20 != (AttVal *)0x0; local_20 = local_20->next) {
      if ((((local_20 != (AttVal *)0x0) && (local_20->dict != (Attribute *)0x0)) &&
          (local_20->dict->id == TidyAttr_ID)) && (BVar1 = hasValue(local_20), BVar1 != no)) {
        (doc->access).HasValidId = yes;
      }
    }
    iVar2 = (doc->access).ForID + 1;
    (doc->access).ForID = iVar2;
    if (iVar2 == 2) {
      (doc->access).ForID = 0;
      CheckFormControls(doc,node);
    }
  }
  return;
}

Assistant:

static void CheckInputLabel( TidyDocImpl* doc, Node* node )
{
    if (Level2_Enabled( doc ))
    {
        AttVal* av;

        /* Checks attributes within the INPUT element */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /* Must have valid 'ID' value */
            if ( attrIsID(av) && hasValue(av) )
                doc->access.HasValidId = yes;
        }

        if ( ++doc->access.ForID == 2 )
        {
            doc->access.ForID = 0;
            CheckFormControls( doc, node );
        }
    }
}